

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O2

bool asmjit::_abi_1_10::ZoneAllocator::_getSlotIndex
               (size_t size,uint32_t *slot,size_t *allocatedSize)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  
  if (size != 0) {
    if (size < 0x201) {
      if (size < 0x81) {
        uVar2 = (uint32_t)(size - 1 >> 5);
        uVar3 = 0x1e0;
        iVar1 = 0x1f;
      }
      else {
        uVar2 = (int)(size + 0x3fffffff7f >> 6) + 4;
        uVar3 = 0x7c0;
        iVar1 = 0x3f;
      }
      *slot = uVar2;
      *allocatedSize = (ulong)(uVar3 & iVar1 + (int)size);
    }
    return size < 0x201;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/../core/zone.h"
             ,0x1f9,"size > 0");
}

Assistant:

static inline bool _getSlotIndex(size_t size, uint32_t& slot, size_t& allocatedSize) noexcept {
    ASMJIT_ASSERT(size > 0);
    if (size > kHiMaxSize)
      return false;

    if (size <= kLoMaxSize) {
      slot = uint32_t((size - 1) / kLoGranularity);
      allocatedSize = Support::alignUp(size, kLoGranularity);
    }
    else {
      slot = uint32_t((size - kLoMaxSize - 1) / kHiGranularity) + kLoCount;
      allocatedSize = Support::alignUp(size, kHiGranularity);
    }

    return true;
  }